

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_movem_16_re_al(void)

{
  uint uVar1;
  uint addr_in;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar3 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(uVar3);
  }
  uVar1 = m68k_read_memory_16(uVar3 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar3 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 4;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(uVar3);
  }
  addr_in = m68k_read_memory_32(uVar3 & m68ki_cpu.address_mask);
  lVar5 = 0;
  iVar4 = 0;
  do {
    if ((uVar1 >> ((uint)lVar5 & 0x1f) & 1) != 0) {
      uVar3 = m68ki_cpu.dar[lVar5];
      my_fc_handler(m68ki_cpu.s_flag | 1);
      uVar2 = addr_in;
      if (m68ki_cpu.pmmu_enabled != 0) {
        uVar2 = pmmu_translate_addr(addr_in);
      }
      m68k_write_memory_16(uVar2 & m68ki_cpu.address_mask,(uint)(ushort)uVar3);
      addr_in = addr_in + 2;
      iVar4 = iVar4 + 1;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  m68ki_remaining_cycles = m68ki_remaining_cycles - (iVar4 << ((byte)m68ki_cpu.cyc_movem_w & 0x1f));
  return;
}

Assistant:

static void m68k_op_movem_16_re_al(void)
{
	uint i = 0;
	uint register_list = OPER_I_16();
	uint ea = EA_AL_16();
	uint count = 0;

	for(; i < 16; i++)
		if(register_list & (1 << i))
		{
			m68ki_write_16(ea, MASK_OUT_ABOVE_16(REG_DA[i]));
			ea += 2;
			count++;
		}

	USE_CYCLES(count<<CYC_MOVEM_W);
}